

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_full_m(REF_DBL *full,REF_DBL *m)

{
  REF_DBL *m_local;
  REF_DBL *full_local;
  
  *m = *full;
  m[1] = full[3];
  m[2] = full[6];
  m[3] = full[4];
  m[4] = full[7];
  m[5] = full[8];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_full_m(REF_DBL *full, REF_DBL *m) {
  m[0] = full[0 + 0 * 3];
  m[1] = full[0 + 1 * 3];
  m[2] = full[0 + 2 * 3];
  m[3] = full[1 + 1 * 3];
  m[4] = full[1 + 2 * 3];
  m[5] = full[2 + 2 * 3];
  return REF_SUCCESS;
}